

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ungetEnterVal(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxId enterId,Status enterStat,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *leaveVal,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *vec,StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *objChange)

{
  Status *pSVar1;
  undefined8 uVar2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar3;
  DataArray<int> *pDVar4;
  int iVar5;
  undefined4 extraout_var;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  pointer pnVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  long lVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_88;
  DataKey local_48;
  undefined8 local_40;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  local_48 = enterId.super_DataKey;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&local_88,(SPxId *)&local_48);
    iVar5 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)&local_88);
    pSVar1 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.rowstat.data;
    if (enterStat == P_ON_UPPER) {
      pSVar1[iVar5] = P_ON_LOWER;
      pnVar7 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      pSVar1[iVar5] = P_ON_UPPER;
      pnVar7 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pcVar6 = &pnVar7[iVar5].m_backend;
    pcVar8 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend;
    local_88.fpclass = cpp_dec_float_finite;
    local_88.prec_elem = 10;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    local_88.data._M_elems[2] = 0;
    local_88.data._M_elems[3] = 0;
    local_88.data._M_elems[4] = 0;
    local_88.data._M_elems[5] = 0;
    local_88.data._M_elems._24_5_ = 0;
    local_88.data._M_elems[7]._1_3_ = 0;
    local_88.data._M_elems._32_5_ = 0;
    local_88.data._M_elems[9]._1_3_ = 0;
    local_88.exp = 0;
    local_88.neg = false;
    pcVar9 = pcVar6;
    if ((&local_88 != pcVar8) && (pcVar9 = pcVar8, &local_88 != pcVar6)) {
      uVar2 = *(undefined8 *)((pcVar6->data)._M_elems + 8);
      local_88.data._M_elems._32_5_ = SUB85(uVar2,0);
      local_88.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
      local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar6->data)._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 2);
      local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 4);
      uVar2 = *(undefined8 *)((pcVar6->data)._M_elems + 6);
      local_88.data._M_elems._24_5_ = SUB85(uVar2,0);
      local_88.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
      local_88.exp = pcVar6->exp;
      local_88.neg = pcVar6->neg;
      local_88.fpclass = pcVar6->fpclass;
      local_88.prec_elem = pcVar6->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_88,pcVar9);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_88);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              (&(this->theFrhs->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend,&leaveVal->m_backend);
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_88,(SPxId *)&local_48);
    iVar5 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)&local_88);
    local_40 = CONCAT44(extraout_var,iVar5);
    pSVar1 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.colstat.data;
    if (enterStat == P_ON_UPPER) {
      pSVar1[iVar5] = P_ON_LOWER;
      pnVar7 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      pSVar1[iVar5] = P_ON_UPPER;
      pnVar7 = (this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pcVar6 = &pnVar7[iVar5].m_backend;
    pcVar8 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend;
    local_88.fpclass = cpp_dec_float_finite;
    local_88.prec_elem = 10;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    local_88.data._M_elems[2] = 0;
    local_88.data._M_elems[3] = 0;
    local_88.data._M_elems[4] = 0;
    local_88.data._M_elems[5] = 0;
    local_88.data._M_elems._24_5_ = 0;
    local_88.data._M_elems[7]._1_3_ = 0;
    local_88.data._M_elems._32_5_ = 0;
    local_88.data._M_elems[9]._1_3_ = 0;
    local_88.exp = 0;
    local_88.neg = false;
    pcVar9 = pcVar6;
    if ((&local_88 != pcVar8) && (pcVar9 = pcVar8, &local_88 != pcVar6)) {
      uVar2 = *(undefined8 *)((pcVar6->data)._M_elems + 8);
      local_88.data._M_elems._32_5_ = SUB85(uVar2,0);
      local_88.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
      local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar6->data)._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 2);
      local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 4);
      uVar2 = *(undefined8 *)((pcVar6->data)._M_elems + 6);
      local_88.data._M_elems._24_5_ = SUB85(uVar2,0);
      local_88.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
      local_88.exp = pcVar6->exp;
      local_88.neg = pcVar6->neg;
      local_88.fpclass = pcVar6->fpclass;
      local_88.prec_elem = pcVar6->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_88,pcVar9);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_88);
    lVar10 = (long)vec->memused;
    if (0 < lVar10) {
      pVVar3 = this->theFrhs;
      uVar11 = lVar10 + 1;
      lVar10 = lVar10 * 0x3c;
      local_38 = this;
      do {
        pcVar6 = (cpp_dec_float<50U,_int,_void> *)
                 ((long)vec->m_elem[-1].val.m_backend.data._M_elems + lVar10);
        pcVar9 = pcVar6;
        if (pcVar6 == &local_88) {
          pcVar9 = &leaveVal->m_backend;
        }
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems._24_5_ = 0;
        local_88.data._M_elems[7]._1_3_ = 0;
        local_88.data._M_elems._32_5_ = 0;
        local_88.data._M_elems[9]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        if ((&local_88 != &leaveVal->m_backend) && (pcVar6 != &local_88)) {
          uVar2 = *(undefined8 *)((leaveVal->m_backend).data._M_elems + 8);
          local_88.data._M_elems._32_5_ = SUB85(uVar2,0);
          local_88.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
          local_88.data._M_elems._0_8_ = *(undefined8 *)(leaveVal->m_backend).data._M_elems;
          local_88.data._M_elems._8_8_ = *(undefined8 *)((leaveVal->m_backend).data._M_elems + 2);
          local_88.data._M_elems._16_8_ = *(undefined8 *)((leaveVal->m_backend).data._M_elems + 4);
          uVar2 = *(undefined8 *)((leaveVal->m_backend).data._M_elems + 6);
          local_88.data._M_elems._24_5_ = SUB85(uVar2,0);
          local_88.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
          local_88.exp = (leaveVal->m_backend).exp;
          local_88.neg = (leaveVal->m_backend).neg;
          local_88.fpclass = (leaveVal->m_backend).fpclass;
          local_88.prec_elem = (leaveVal->m_backend).prec_elem;
          pcVar9 = pcVar6;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_88,pcVar9)
        ;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&(pVVar3->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&vec->m_elem[-1].val + 1) + lVar10)].m_backend,&local_88);
        uVar11 = uVar11 - 1;
        this = local_38;
        lVar10 = lVar10 + -0x3c;
      } while (1 < uVar11);
    }
    iVar5 = (int)local_40;
  }
  pVVar3 = &this->theTest;
  pDVar4 = &this->isInfeasibleCo;
  if (this->theRep * local_48.info < 1) {
    pVVar3 = &this->theCoTest;
    pDVar4 = &this->isInfeasible;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(pVVar3->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend,0);
  pDVar4->data[iVar5] = 0;
  return;
}

Assistant:

void
SPxSolverBase<R>::ungetEnterVal(
   SPxId enterId,
   typename SPxBasisBase<R>::Desc::Status enterStat,
   R leaveVal,
   const SVectorBase<R>& vec,
   StableSum<R>& objChange
)
{
   assert(rep() == COLUMN);
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));

      if(enterStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
      {
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         objChange += theLCbound[enterIdx] * this->maxObj(enterIdx);
      }
      else
      {
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         objChange += theUCbound[enterIdx] * this->maxObj(enterIdx);
      }

      theFrhs->multAdd(leaveVal, vec);
   }
   else
   {
      enterIdx = this->number(SPxRowId(enterId));
      assert(enterId.isSPxRowId());

      if(enterStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
      {
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         objChange += (theURbound[enterIdx]) * this->maxRowObj(enterIdx);
      }
      else
      {
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         objChange += (theLRbound[enterIdx]) * this->maxRowObj(enterIdx);
      }

      (*theFrhs)[enterIdx] += leaveVal;
   }

   if(isId(enterId))
   {
      theTest[enterIdx] = 0;
      isInfeasibleCo[enterIdx] = SPxPricer<R>::NOT_VIOLATED;
   }
   else
   {
      theCoTest[enterIdx] = 0;
      isInfeasible[enterIdx] = SPxPricer<R>::NOT_VIOLATED;
   }
}